

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

void tcu::FloatFormat_selfTest(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  FloatFormat *pFVar8;
  TestError *this;
  TestBinary32 test32;
  Test local_58;
  string local_48;
  double local_28;
  
  pFVar8 = (FloatFormat *)operator_new(0x28);
  pFVar8->m_minExp = -0x7e;
  pFVar8->m_maxExp = 0x7f;
  pFVar8->m_fractionBits = 0x17;
  pFVar8->m_hasSubnormal = MAYBE;
  pFVar8->m_hasInf = MAYBE;
  pFVar8->m_hasNaN = MAYBE;
  pFVar8->m_exactPrecision = true;
  dVar2 = ldexp(1.0,0x7f);
  dVar3 = ldexp(8388607.0,0x68);
  pFVar8->m_maxValue = dVar3 + dVar2;
  local_58.m_fmt.super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data.
  ptr = pFVar8;
  dVar2 = ldexp(1.0,0);
  dVar3 = ldexp(1.0,-0x18);
  anon_unknown_4::Test::testULP(&local_58,dVar2,dVar3);
  dVar2 = ldexp(1.0,0);
  dVar3 = ldexp(1.0,-0x17);
  dVar4 = ldexp(1.0,-0x17);
  anon_unknown_4::Test::testULP(&local_58,dVar3 + dVar2,dVar4);
  dVar2 = ldexp(1.0,-0x7c);
  dVar3 = ldexp(1.0,-0x94);
  anon_unknown_4::Test::testULP(&local_58,dVar2,dVar3);
  dVar2 = ldexp(1.0,-0x7d);
  dVar3 = ldexp(1.0,-0x95);
  anon_unknown_4::Test::testULP(&local_58,dVar2,dVar3);
  dVar2 = ldexp(1.0,-0x7d);
  dVar3 = ldexp(1.0,-0x8c);
  dVar4 = ldexp(1.0,-0x94);
  anon_unknown_4::Test::testULP(&local_58,dVar3 + dVar2,dVar4);
  dVar2 = ldexp(1.0,-0x7e);
  dVar3 = ldexp(1.0,-0x95);
  anon_unknown_4::Test::testULP(&local_58,dVar2,dVar3);
  dVar2 = ldexp(1.0,-0x82);
  dVar3 = ldexp(1.0,-0x95);
  anon_unknown_4::Test::testULP(&local_58,dVar2,dVar3);
  dVar2 = ldexp(1.0,0);
  dVar3 = ldexp(1.0,-0x14);
  local_28 = ldexp(1.0,-0x28);
  local_28 = local_28 + dVar3 + dVar2;
  dVar2 = ldexp(1.0,0);
  dVar3 = ldexp(1.0,-0x14);
  dVar4 = ldexp(1.0,0);
  dVar5 = ldexp(1.0,-0x14);
  dVar6 = ldexp(1.0,-0x17);
  anon_unknown_4::Test::testRound(&local_58,local_28,dVar2 + dVar3,dVar4 + dVar5 + dVar6);
  dVar2 = ldexp(1.0,-0x7e);
  dVar3 = ldexp(1.0,-0x96);
  dVar4 = ldexp(1.0,-0x7e);
  dVar5 = ldexp(1.0,-0x95);
  dVar6 = ldexp(1.0,-0x7e);
  anon_unknown_4::Test::testRound(&local_58,dVar2 - dVar3,dVar4 - dVar5,dVar6);
  dVar2 = ldexp(1.0,0);
  FloatFormat::floatToHex_abi_cxx11_(&local_48,pFVar8,dVar2);
  iVar7 = std::__cxx11::string::compare((char *)&local_48);
  paVar1 = &local_48.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (iVar7 == 0) {
    dVar2 = ldexp(1.0,8);
    dVar3 = ldexp(1.0,-4);
    FloatFormat::floatToHex_abi_cxx11_(&local_48,pFVar8,dVar3 + dVar2);
    iVar7 = std::__cxx11::string::compare((char *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    pFVar8 = local_58.m_fmt.
             super_UniqueBase<tcu::FloatFormat,_de::DefaultDeleter<tcu::FloatFormat>_>.m_data.ptr;
    if (iVar7 == 0) {
      dVar2 = ldexp(1.0,-0x8c);
      FloatFormat::floatToHex_abi_cxx11_(&local_48,pFVar8,dVar2);
      iVar7 = std::__cxx11::string::compare((char *)&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != paVar1) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (iVar7 == 0) {
        dVar2 = ldexp(1.0,-0x8c);
        FloatFormat::floatToHex_abi_cxx11_(&local_48,pFVar8,dVar2);
        iVar7 = std::__cxx11::string::compare((char *)&local_48);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (iVar7 == 0) {
          dVar2 = ldexp(1.0,-0x7e);
          dVar3 = ldexp(1.0,-0x7d);
          FloatFormat::floatToHex_abi_cxx11_(&local_48,pFVar8,dVar3 + dVar2);
          iVar7 = std::__cxx11::string::compare((char *)&local_48);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_48._M_dataplus._M_p != paVar1) {
            operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
          }
          if (iVar7 == 0) {
            operator_delete(pFVar8,0x28);
            return;
          }
          this = (TestError *)__cxa_allocate_exception(0x38);
          TestError::TestError
                    (this,(char *)0x0,"m_fmt->floatToHex(p(-126) + p(-125)) == \"0x1.800000p-125\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                     ,0x17b);
        }
        else {
          this = (TestError *)__cxa_allocate_exception(0x38);
          TestError::TestError
                    (this,(char *)0x0,"m_fmt->floatToHex(p(-140)) == \"0x0.000400p-126\"",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                     ,0x17a);
        }
      }
      else {
        this = (TestError *)__cxa_allocate_exception(0x38);
        TestError::TestError
                  (this,(char *)0x0,"m_fmt->floatToHex(p(-140)) == \"0x0.000400p-126\"",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                   ,0x179);
      }
    }
    else {
      this = (TestError *)__cxa_allocate_exception(0x38);
      TestError::TestError
                (this,(char *)0x0,"m_fmt->floatToHex(p(8) + p(-4)) == \"0x1.001000p8\"",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
                 ,0x178);
    }
  }
  else {
    this = (TestError *)__cxa_allocate_exception(0x38);
    TestError::TestError
              (this,(char *)0x0,"m_fmt->floatToHex(p(0)) == \"0x1.000000p0\"",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuFloatFormat.cpp"
               ,0x177);
  }
  __cxa_throw(this,&TestError::typeinfo,Exception::~Exception);
}

Assistant:

TestBinary32 (void)
				: Test (MovePtr<FloatFormat>(new FloatFormat(-126, 127, 23, true))) {}